

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O1

int disasm_acall_offset(em8051 *aCPU,int aPosition,char *aBuffer)

{
  ulong uVar1;
  
  uVar1 = (long)aCPU->mCodeMemSize - 1;
  sprintf(aBuffer,"ACALL %04Xh",
          (ulong)(((uint)aCPU->mCodeMem[uVar1 & (long)aPosition + 1U] | aPosition + 2U & 0xf800) +
                 (aCPU->mCodeMem[(int)(aPosition & (uint)uVar1)] & 0xffffffe0) * 8));
  return 2;
}

Assistant:

static int disasm_acall_offset(struct em8051 *aCPU, int aPosition, char *aBuffer)
{
    sprintf(aBuffer,"ACALL %04Xh",
        (aPosition + 2) & 0xf800 |
        aCPU->mCodeMem[(aPosition + 1)&(aCPU->mCodeMemSize-1)] | 
        ((aCPU->mCodeMem[(aPosition)&(aCPU->mCodeMemSize-1)] & 0xe0) << 3));
    return 2;
}